

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.cpp
# Opt level: O2

bool __thiscall AllDiffDomain<0>::prune(AllDiffDomain<0> *this,int node,int i)

{
  bool *pbVar1;
  Node *pNVar2;
  IntVar *pIVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  Clause *this_00;
  Lit *pLVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  
  if (so.lazy) {
    uVar10 = this->val_nodes[i].scc;
    iVar6 = this->sz;
    pbVar1 = this->scoreboard;
    pNVar2 = this->var_nodes;
    iVar5 = 0;
    iVar15 = 0x7fffffff;
    iVar14 = -0x80000000;
    iVar12 = 0;
    for (uVar7 = uVar10; -1 < (int)uVar7; uVar7 = pNVar2[uVar7].next) {
      iVar13 = uVar7 - iVar6;
      if ((int)uVar7 < iVar6) {
        iVar12 = iVar12 + 1;
      }
      else {
        iVar5 = iVar5 + 1;
        if (iVar13 < iVar15) {
          iVar15 = iVar13;
        }
        if (iVar14 <= iVar13) {
          iVar14 = iVar13;
        }
        pbVar1[iVar13] = true;
      }
    }
    if (iVar5 == 1) {
      this_00 = Reason_new(2);
      if (this->sz <= (int)uVar10) {
        uVar10 = this->var_nodes[(int)uVar10].next;
      }
      iVar6 = (*((this->x[(int)uVar10].var)->super_Var).super_Branching._vptr_Branching[10])();
      pLVar8 = Clause::operator[](this_00,1);
      pLVar8->x = iVar6;
    }
    else {
      iVar6 = 1;
      this_00 = Reason_new(iVar12 * ((iVar14 - (iVar5 + iVar15)) + 3) + 1);
      for (; -1 < (int)uVar10; uVar10 = this->var_nodes[uVar10].next) {
        if ((int)uVar10 < this->sz) {
          pIVar3 = this->x[uVar10].var;
          uVar7 = (*(pIVar3->super_Var).super_Branching._vptr_Branching[0xd])(pIVar3,(long)iVar15,2)
          ;
          lVar11 = (long)iVar15;
          iVar5 = iVar6;
          do {
            pLVar8 = Clause::operator[](this_00,iVar5);
            pLVar8->x = uVar7 ^ 1;
            lVar9 = lVar11;
            do {
              lVar11 = lVar9 + 1;
              if (iVar14 <= lVar11) {
                pIVar3 = this->x[uVar10].var;
                uVar7 = (*(pIVar3->super_Var).super_Branching._vptr_Branching[0xd])
                                  (pIVar3,(long)iVar14,3);
                iVar6 = iVar5 + 2;
                pLVar8 = Clause::operator[](this_00,iVar5 + 1);
                pLVar8->x = uVar7 ^ 1;
                goto LAB_00147049;
              }
              lVar4 = lVar9 + 1;
              lVar9 = lVar11;
            } while (this->scoreboard[lVar4] != false);
            pIVar3 = this->x[uVar10].var;
            uVar7 = (*(pIVar3->super_Var).super_Branching._vptr_Branching[0xd])(pIVar3,lVar11,0);
            iVar5 = iVar5 + 1;
          } while( true );
        }
LAB_00147049:
      }
    }
    memset(this->scoreboard + iVar15,0,(long)((iVar14 - iVar15) + 1));
  }
  else {
    this_00 = (Clause *)0x0;
  }
  pIVar3 = this->x[node].var;
  iVar6 = (*(pIVar3->super_Var).super_Branching._vptr_Branching[0x11])(pIVar3,(long)i,this_00,1);
  return SUB41(iVar6,0);
}

Assistant:

bool prune(int node, int i) {
		// fprintf(stderr, "prune var %d val %d\n", node, i);
		Clause* r = nullptr;
		if (so.lazy) {
			int vars = 0;
			int vals = 0;
			int min_val = INT_MAX;
			int max_val = INT_MIN;
			const int scc = val_nodes[i].scc;
			for (int j = scc; j >= 0; j = var_nodes[j].next) {
				if (j < sz) {
					++vars;
				} else {
					++vals;
					min_val = std::min(min_val, j - sz);
					max_val = std::max(max_val, j - sz);
					scoreboard[j - sz] = true;
				}
			}
			assert(vars == vals);
			if (vals == 1) {
				r = Reason_new(2);
				(*r)[1] = x[(scc < sz) ? scc : var_nodes[scc].next].getValLit();
			} else {
				r = Reason_new(1 + vars * (2 + (max_val + 1 - min_val) - vals));
				int k = 1;
				for (int j = scc; j >= 0; j = var_nodes[j].next) {
					if (j < sz) {
						(*r)[k++] = ~x[j].getLit(min_val, LR_GE);
						for (int v = min_val + 1; v < max_val; ++v) {
							if (!scoreboard[v]) {
								(*r)[k++] = ~x[j].getLit(v, LR_NE);
							}
						}
						(*r)[k++] = ~x[j].getLit(max_val, LR_LE);
					}
				}
				assert(k == 1 + vars * (2 + (max_val + 1 - min_val) - vals));
			}
			memset(scoreboard + min_val, 0, max_val + 1 - min_val);
		}
		return x[node].remVal(i, r);
	}